

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O3

void __thiscall QToolBoxButton::~QToolBoxButton(QToolBoxButton *this)

{
  QWidgetData **this_00;
  
  this_00 = &this[-1].super_QAbstractButton.super_QWidget.data;
  QAbstractButton::~QAbstractButton((QAbstractButton *)this_00);
  operator_delete(this_00,0x30);
  return;
}

Assistant:

class QToolBoxButton : public QAbstractButton
{
    Q_OBJECT
public:
    QToolBoxButton(QWidget *parent)
        : QAbstractButton(parent), selected(false), indexInPage(-1)
    {
        setBackgroundRole(QPalette::Window);
        setSizePolicy(QSizePolicy::Preferred, QSizePolicy::Minimum);
        setFocusPolicy(Qt::NoFocus);
    }

    inline void setSelected(bool b) { selected = b; update(); }